

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttributesImpl.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::VecAttributesImpl::getIndex
          (VecAttributesImpl *this,XMLCh *uri,XMLCh *localPart,XMLSize_t *index)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  int iVar5;
  undefined4 extraout_var;
  XMLAttr *pXVar6;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  long lVar9;
  bool bVar10;
  XMLSize_t getAt;
  MemoryManager *pMVar11;
  XMLBuffer uriBuffer;
  XMLBuffer local_68;
  
  pMVar11 = (this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).fMemoryManager;
  bVar10 = false;
  local_68.fIndex = 0;
  local_68.fCapacity = 0x3ff;
  local_68.fFullSize = 0;
  local_68.fUsed = false;
  local_68.fFullHandler = (XMLBufferFullHandler *)0x0;
  local_68.fMemoryManager = pMVar11;
  iVar5 = (*pMVar11->_vptr_MemoryManager[3])(pMVar11);
  local_68.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar5);
  *local_68.fBuffer = L'\0';
  *index = 0;
  if (this->fCount != 0) {
    getAt = 0;
    do {
      pXVar6 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                         (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
      XMLScanner::getURIText(this->fScanner,pXVar6->fAttName->fURIId,&local_68);
      pXVar7 = pXVar6->fAttName->fLocalPart;
      pMVar11 = local_68.fMemoryManager;
      if (pXVar7 == localPart) {
LAB_002b62ce:
        local_68.fBuffer[local_68.fIndex] = L'\0';
        bVar10 = true;
        if (local_68.fBuffer == uri) goto LAB_002b6335;
        if (uri == (XMLCh *)0x0) {
          XVar3 = *local_68.fBuffer;
joined_r0x002b6309:
          if (XVar3 == L'\0') goto LAB_002b6335;
        }
        else {
          lVar9 = 0;
          do {
            psVar1 = (short *)((long)local_68.fBuffer + lVar9);
            if (*psVar1 == 0) {
              XVar3 = *(XMLCh *)((long)uri + lVar9);
              goto joined_r0x002b6309;
            }
            psVar2 = (short *)((long)uri + lVar9);
            lVar9 = lVar9 + 2;
          } while (*psVar1 == *psVar2);
        }
      }
      else {
        pXVar8 = localPart;
        if ((localPart == (XMLCh *)0x0) || (pXVar7 == (XMLCh *)0x0)) {
          if (pXVar7 == (XMLCh *)0x0) {
            if (localPart == (XMLCh *)0x0) goto LAB_002b62ce;
LAB_002b62c8:
            XVar3 = *pXVar8;
          }
          else {
            XVar3 = *pXVar7;
            if ((localPart != (XMLCh *)0x0) && (XVar3 == L'\0')) goto LAB_002b62c8;
          }
          if (XVar3 == L'\0') goto LAB_002b62ce;
        }
        else {
          do {
            XVar3 = *pXVar7;
            if (XVar3 == L'\0') goto LAB_002b62c8;
            pXVar7 = pXVar7 + 1;
            XVar4 = *pXVar8;
            pXVar8 = pXVar8 + 1;
          } while (XVar3 == XVar4);
        }
      }
      getAt = *index + 1;
      *index = getAt;
    } while (getAt < this->fCount);
    bVar10 = false;
  }
LAB_002b6335:
  (*pMVar11->_vptr_MemoryManager[4])(pMVar11,local_68.fBuffer);
  return bVar10;
}

Assistant:

bool VecAttributesImpl::getIndex(const XMLCh* const uri,
                                 const XMLCh* const localPart,
                                 XMLSize_t& index) const
{
  //
  //  Search the vector for the attribute with the given name and return
  //  its type.
  //
  XMLBuffer uriBuffer(1023, fVector->getMemoryManager()) ;
  for (index = 0; index < fCount; index++)
  {
    const XMLAttr* curElem = fVector->elementAt(index);

    fScanner->getURIText(curElem->getURIId(), uriBuffer) ;

    if ( (XMLString::equals(curElem->getName(), localPart)) &&
         (XMLString::equals(uriBuffer.getRawBuffer(), uri)) )
      return true;
  }
  return false;
}